

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall cs222::Parser::hasNext(Parser *this)

{
  __uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_> __p;
  __uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_> local_20;
  
  if ((this->nextInstruction)._M_t.
      super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
      super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    return true;
  }
  (**this->_vptr_Parser)(&local_20,this);
  __p._M_t.super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
  super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl =
       local_20._M_t.
       super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
       super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
  super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl =
       (tuple<cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>)
       (_Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>)0x0;
  std::__uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::reset
            ((__uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
             &this->nextInstruction,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>
                      .super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl);
  std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
            ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)&local_20);
  return (this->nextInstruction)._M_t.
         super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
         super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
         super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl != (Instruction *)0x0;
}

Assistant:

bool Parser::hasNext()
    {
        if (nextInstruction) {
            return true;
        }
        nextInstruction = next();
        return nextInstruction != nullptr;
    }